

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR reparse_path_expr(ly_ctx *ctx,lyxp_expr *exp,uint32_t *tok_idx,uint32_t depth)

{
  uint32_t uVar1;
  lyxp_token lVar2;
  uint tok_idx_00;
  lyxp_token *plVar3;
  LY_ERR ret__;
  LY_ERR LVar4;
  LY_ERR LVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  char *pcVar11;
  LY_ERR ret___1;
  uint32_t uVar12;
  uint uVar13;
  bool bVar14;
  uint local_4c;
  
  uVar1 = *tok_idx;
  uVar12 = exp->used;
  if (ctx != (ly_ctx *)0x0 && uVar12 == uVar1) {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath expression end.");
  }
  if (uVar12 == uVar1) {
    return LY_EVALID;
  }
  uVar8 = *tok_idx;
  switch(exp->tokens[uVar8]) {
  case LYXP_TOKEN_PAR1:
    *tok_idx = uVar8 + 1;
    LVar4 = reparse_or_expr(ctx,exp,tok_idx,depth);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    LVar4 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_PAR2);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    uVar8 = *tok_idx;
    goto LAB_001abfbe;
  default:
    pcVar7 = lyxp_token2str(exp->tokens[uVar8]);
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath token \"%s\" (\"%.15s\").",pcVar7,
            exp->expr + exp->tok_pos[*tok_idx]);
    return LY_EVALID;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
  case LYXP_TOKEN_AXISNAME:
    LVar4 = reparse_relative_location_path(ctx,exp,tok_idx,depth);
    goto joined_r0x001ac212;
  case LYXP_TOKEN_VARREF:
  case LYXP_TOKEN_LITERAL:
  case LYXP_TOKEN_NUMBER:
LAB_001abfbe:
    *tok_idx = uVar8 + 1;
    while( true ) {
      uVar8 = *tok_idx;
      if (exp->used == uVar8) break;
      if (exp->tokens[uVar8] != LYXP_TOKEN_BRACK1) {
        if ((exp->used == uVar8) ||
           ((exp->tokens[uVar8] & ~LYXP_TOKEN_PAR1) != LYXP_TOKEN_OPER_PATH)) break;
        *tok_idx = uVar8 + 1;
        LVar4 = reparse_relative_location_path(ctx,exp,tok_idx,depth);
        goto joined_r0x001ac212;
      }
      LVar4 = reparse_predicate(ctx,exp,tok_idx,depth);
joined_r0x001ac938:
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
    }
    goto LAB_001ac214;
  case LYXP_TOKEN_FUNCNAME:
    LVar5 = lyxp_check_token(ctx,exp,uVar8,LYXP_TOKEN_FUNCNAME);
    LVar4 = LVar5;
    if (LVar5 != LY_SUCCESS) goto joined_r0x001ac938;
    break;
  case LYXP_TOKEN_OPER_PATH:
  case LYXP_TOKEN_OPER_RPATH:
    LVar4 = exp_check_token2(ctx,exp,uVar8,LYXP_TOKEN_OPER_PATH,LYXP_TOKEN_OPER_RPATH);
    if (LVar4 == LY_SUCCESS) {
      plVar3 = exp->tokens;
      uVar8 = *tok_idx + 1;
      lVar2 = plVar3[*tok_idx];
      *tok_idx = uVar8;
      if (lVar2 == LYXP_TOKEN_OPER_PATH) {
        LVar4 = LY_SUCCESS;
        if (exp->used != uVar8) {
          lVar2 = plVar3[uVar8];
          if ((lVar2 < LYXP_TOKEN_LITERAL) &&
             ((0x400ce0U >> (lVar2 & (LYXP_TOKEN_NUMBER|LYXP_TOKEN_AT)) & 1) != 0))
          goto LAB_001ac1f9;
          goto LAB_001ac20c;
        }
      }
      else {
LAB_001ac1f9:
        LVar4 = reparse_relative_location_path(ctx,exp,tok_idx,depth);
        if (LVar4 == LY_SUCCESS) {
LAB_001ac20c:
          LVar4 = LY_SUCCESS;
        }
      }
    }
joined_r0x001ac212:
    if (LVar4 == LY_SUCCESS) {
LAB_001ac214:
      LVar4 = LY_SUCCESS;
    }
    return LVar4;
  }
  uVar8 = *tok_idx;
  uVar13 = exp->tok_len[uVar8];
  local_4c = 0xffffffff;
  bVar14 = true;
  uVar10 = 0;
  switch(uVar13) {
  case 3:
    uVar10 = exp->tok_pos[uVar8];
    pcVar7 = exp->expr;
    iVar6 = strncmp(pcVar7 + uVar10,"not",3);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7 + uVar10,"sum",3);
joined_r0x001ac523:
      bVar14 = true;
      uVar10 = 0;
      if (iVar6 == 0) {
        bVar14 = false;
        uVar10 = 1;
        local_4c = 1;
      }
      goto switchD_001ac10e_caseD_e;
    }
    break;
  case 4:
    pcVar7 = exp->expr + exp->tok_pos[uVar8];
    iVar6 = strncmp(pcVar7,"lang",4);
    local_4c = 0;
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7,"last",4);
      if (iVar6 != 0) {
        iVar6 = strncmp(pcVar7,"name",4);
        if (iVar6 != 0) {
          pcVar11 = "true";
          sVar9 = 4;
          goto LAB_001ac5ac;
        }
LAB_001ac716:
        local_4c = 0;
        goto LAB_001ac77d;
      }
      uVar10 = 0;
      goto LAB_001ac790;
    }
    break;
  case 5:
    pcVar7 = exp->expr + exp->tok_pos[uVar8];
    iVar6 = strncmp(pcVar7,"count",5);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7,"false",5);
      if (iVar6 == 0) {
LAB_001ac722:
        bVar14 = false;
        local_4c = 0;
        uVar10 = 0;
        goto switchD_001ac10e_caseD_e;
      }
      iVar6 = strncmp(pcVar7,"floor",5);
      if ((iVar6 != 0) && (iVar6 = strncmp(pcVar7,"round",5), iVar6 != 0)) {
        iVar6 = strncmp(pcVar7,"deref",5);
        goto joined_r0x001ac523;
      }
    }
    break;
  case 6:
    pcVar7 = exp->expr + exp->tok_pos[uVar8];
    iVar6 = strncmp(pcVar7,"concat",6);
    local_4c = 0;
    if (iVar6 == 0) {
      local_4c = 2;
      uVar10 = 0xffffffff;
    }
    else {
      iVar6 = strncmp(pcVar7,"number",6);
      uVar10 = 1;
      if (iVar6 != 0) {
        iVar6 = strncmp(pcVar7,"string",6);
        goto joined_r0x001ac28e;
      }
    }
    goto LAB_001ac790;
  case 7:
    pcVar7 = exp->expr + exp->tok_pos[uVar8];
    iVar6 = strncmp(pcVar7,"boolean",7);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7,"ceiling",7);
      if (iVar6 != 0) {
        pcVar11 = "current";
        sVar9 = 7;
LAB_001ac5ac:
        iVar6 = strncmp(pcVar7,pcVar11,sVar9);
        bVar14 = iVar6 != 0;
        local_4c = -(uint)bVar14;
        uVar10 = 0;
        goto switchD_001ac10e_caseD_e;
      }
      local_4c = 1;
LAB_001ac77d:
      bVar14 = false;
      uVar10 = 1;
      goto switchD_001ac10e_caseD_e;
    }
    break;
  case 8:
    pcVar7 = exp->expr + exp->tok_pos[uVar8];
    iVar6 = strncmp(pcVar7,"contains",8);
    if (iVar6 == 0) {
LAB_001ac74d:
      bVar14 = false;
      uVar10 = 2;
      local_4c = 2;
      goto switchD_001ac10e_caseD_e;
    }
    iVar6 = strncmp(pcVar7,"position",8);
    if (iVar6 == 0) goto LAB_001ac722;
    iVar6 = strncmp(pcVar7,"re-match",8);
    bVar14 = true;
    uVar10 = 0;
    if (iVar6 != 0) goto switchD_001ac10e_caseD_e;
    goto LAB_001ac6f4;
  case 9:
    uVar10 = exp->tok_pos[uVar8];
    pcVar7 = exp->expr;
    iVar6 = strncmp(pcVar7 + uVar10,"substring",9);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7 + uVar10,"translate",9);
      uVar10 = 0;
      bVar14 = true;
      if (iVar6 == 0) {
        uVar10 = 3;
        bVar14 = false;
        local_4c = 3;
      }
      goto switchD_001ac10e_caseD_e;
    }
    local_4c = 2;
    uVar10 = 3;
LAB_001ac790:
    bVar14 = false;
    goto switchD_001ac10e_caseD_e;
  case 10:
    pcVar7 = exp->expr + exp->tok_pos[uVar8];
    iVar6 = strncmp(pcVar7,"local-name",10);
    if (iVar6 == 0) {
LAB_001ac73c:
      bVar14 = false;
      uVar10 = 1;
      local_4c = 0;
      goto switchD_001ac10e_caseD_e;
    }
    iVar6 = strncmp(pcVar7,"enum-value",10);
    if (iVar6 == 0) break;
    iVar6 = strncmp(pcVar7,"bit-is-set",10);
    goto joined_r0x001ac6e7;
  case 0xb:
    pcVar11 = exp->expr + exp->tok_pos[uVar8];
    pcVar7 = "starts-with";
    sVar9 = 0xb;
    goto LAB_001ac6dc;
  case 0xc:
    pcVar11 = exp->expr + exp->tok_pos[uVar8];
    pcVar7 = "derived-from";
    sVar9 = 0xc;
    goto LAB_001ac6dc;
  case 0xd:
    uVar10 = exp->tok_pos[uVar8];
    pcVar7 = exp->expr;
    iVar6 = strncmp(pcVar7 + uVar10,"namespace-uri",0xd);
    if (iVar6 == 0) goto LAB_001ac73c;
    iVar6 = strncmp(pcVar7 + uVar10,"string-length",0xd);
joined_r0x001ac28e:
    if (iVar6 == 0) goto LAB_001ac716;
    goto LAB_001ac468;
  default:
    goto switchD_001ac10e_caseD_e;
  case 0xf:
    uVar10 = exp->tok_pos[uVar8];
    pcVar7 = exp->expr;
    iVar6 = strncmp(pcVar7 + uVar10,"normalize-space",0xf);
    if (iVar6 == 0) goto LAB_001ac73c;
    iVar6 = strncmp(pcVar7 + uVar10,"substring-after",0xf);
    if (iVar6 == 0) goto LAB_001ac74d;
LAB_001ac468:
    local_4c = 0xffffffff;
    uVar10 = 0;
    bVar14 = true;
    goto switchD_001ac10e_caseD_e;
  case 0x10:
    pcVar11 = exp->expr + exp->tok_pos[uVar8];
    pcVar7 = "substring-before";
    sVar9 = 0x10;
    goto LAB_001ac6dc;
  case 0x14:
    pcVar11 = exp->expr + exp->tok_pos[uVar8];
    pcVar7 = "derived-from-or-self";
    sVar9 = 0x14;
LAB_001ac6dc:
    iVar6 = strncmp(pcVar11,pcVar7,sVar9);
joined_r0x001ac6e7:
    bVar14 = true;
    uVar10 = 0;
    if (iVar6 == 0) {
LAB_001ac6f4:
      bVar14 = false;
      uVar10 = 2;
      local_4c = 2;
    }
    goto switchD_001ac10e_caseD_e;
  }
  bVar14 = false;
  uVar10 = 1;
  local_4c = 1;
switchD_001ac10e_caseD_e:
  if (bVar14) {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unknown XPath function \"%.*s\".",(ulong)uVar13,
            exp->expr + exp->tok_pos[uVar8]);
    LVar4 = LY_EINVAL;
    goto joined_r0x001ac938;
  }
  *tok_idx = uVar8 + 1;
  LVar4 = lyxp_check_token(ctx,exp,uVar8 + 1,LYXP_TOKEN_PAR1);
  if (LVar4 != LY_SUCCESS) goto joined_r0x001ac938;
  uVar12 = *tok_idx + 1;
  *tok_idx = uVar12;
  uVar1 = exp->used;
  if ((uVar1 == uVar12) && (LVar5 = LY_EINCOMPLETE, ctx != (ly_ctx *)0x0)) {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath expression end.");
  }
  LVar4 = LVar5;
  if (uVar1 == uVar12) goto joined_r0x001ac938;
  uVar13 = 0;
  if (exp->tokens[*tok_idx] != LYXP_TOKEN_PAR2) {
    LVar4 = reparse_or_expr(ctx,exp,tok_idx,depth);
    if (LVar4 != LY_SUCCESS) goto joined_r0x001ac938;
    uVar13 = 1;
  }
  while( true ) {
    tok_idx_00 = *tok_idx;
    if ((exp->used == tok_idx_00) || (exp->tokens[tok_idx_00] != LYXP_TOKEN_COMMA)) break;
    *tok_idx = tok_idx_00 + 1;
    uVar13 = uVar13 + 1;
    LVar4 = reparse_or_expr(ctx,exp,tok_idx,depth);
    if (LVar4 != LY_SUCCESS) goto joined_r0x001ac938;
  }
  LVar4 = lyxp_check_token(ctx,exp,tok_idx_00,LYXP_TOKEN_PAR2);
  if (LVar4 != LY_SUCCESS) goto joined_r0x001ac938;
  *tok_idx = *tok_idx + 1;
  LVar4 = LY_SUCCESS;
  if (local_4c <= uVar13 && uVar13 <= uVar10) goto joined_r0x001ac938;
  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Invalid number of arguments (%u) for the XPath function %.*s."
          ,(ulong)uVar13,(ulong)exp->tok_len[uVar8],exp->expr + exp->tok_pos[uVar8]);
  LVar4 = LY_EVALID;
  goto joined_r0x001ac938;
}

Assistant:

static LY_ERR
reparse_path_expr(const struct ly_ctx *ctx, struct lyxp_expr *exp, uint32_t *tok_idx, uint32_t depth)
{
    LY_ERR rc;

    if (lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NONE)) {
        return LY_EVALID;
    }

    switch (exp->tokens[*tok_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' Predicate* */
        ++(*tok_idx);

        rc = reparse_or_expr(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);

        rc = lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_PAR2);
        LY_CHECK_RET(rc);
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AXISNAME:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        rc = reparse_relative_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        break;
    case LYXP_TOKEN_VARREF:
        /* VariableReference */
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        rc = reparse_function_call(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        goto predicate;
    case LYXP_TOKEN_OPER_PATH:
    case LYXP_TOKEN_OPER_RPATH:
        /* AbsoluteLocationPath */
        rc = reparse_absolute_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        break;
    case LYXP_TOKEN_LITERAL:
        /* Literal */
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_NUMBER:
        /* Number */
        ++(*tok_idx);
        goto predicate;
    default:
        LOGVAL(ctx, LY_VCODE_XP_INTOK, lyxp_token2str(exp->tokens[*tok_idx]), &exp->expr[exp->tok_pos[*tok_idx]]);
        return LY_EVALID;
    }

    return LY_SUCCESS;

predicate:
    /* Predicate* */
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_BRACK1)) {
        rc = reparse_predicate(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    /* ('/' or '//') RelativeLocationPath */
    if (!exp_check_token2(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_PATH, LYXP_TOKEN_OPER_RPATH)) {

        /* '/' or '//' */
        ++(*tok_idx);

        rc = reparse_relative_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    return LY_SUCCESS;
}